

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u8 minMaxQuery(sqlite3 *db,Expr *pFunc,ExprList **ppMinMax)

{
  byte bVar1;
  int iVar2;
  ExprList *pEVar3;
  long lVar4;
  u8 uVar5;
  u8 uVar6;
  
  pEVar3 = (pFunc->x).pList;
  if ((((pEVar3 == (ExprList *)0x0) || (pEVar3->nExpr != 1)) || ((pFunc->flags & 0x1000000) != 0))
     || ((db->dbOptFlags & 0x10000) != 0)) {
    return '\0';
  }
  lVar4 = 0;
  do {
    bVar1 = (pFunc->u).zToken[lVar4];
    if (bVar1 == "min"[lVar4]) {
      if ((ulong)bVar1 == 0) goto LAB_0019a602;
    }
    else if (""[bVar1] != ""[(byte)"min"[lVar4]]) {
      lVar4 = 0;
      break;
    }
    lVar4 = lVar4 + 1;
  } while( true );
LAB_0019a622:
  bVar1 = (pFunc->u).zToken[lVar4];
  if (bVar1 == "max"[lVar4]) {
    if ((ulong)bVar1 == 0) goto LAB_0019a653;
  }
  else if (""[bVar1] != ""[(byte)"max"[lVar4]]) {
    return '\0';
  }
  lVar4 = lVar4 + 1;
  goto LAB_0019a622;
LAB_0019a653:
  uVar6 = '\x01';
  uVar5 = '\x02';
  goto LAB_0019a659;
LAB_0019a602:
  iVar2 = sqlite3ExprCanBeNull(pEVar3->a[0].pExpr);
  uVar6 = (iVar2 != 0) * '\x02';
  uVar5 = '\x01';
LAB_0019a659:
  pEVar3 = sqlite3ExprListDup(db,pEVar3,0);
  *ppMinMax = pEVar3;
  if (pEVar3 != (ExprList *)0x0) {
    pEVar3->a[0].fg.sortFlags = uVar6;
  }
  return uVar5;
}

Assistant:

static u8 minMaxQuery(sqlite3 *db, Expr *pFunc, ExprList **ppMinMax){
  int eRet = WHERE_ORDERBY_NORMAL;      /* Return value */
  ExprList *pEList;                     /* Arguments to agg function */
  const char *zFunc;                    /* Name of aggregate function pFunc */
  ExprList *pOrderBy;
  u8 sortFlags = 0;

  assert( *ppMinMax==0 );
  assert( pFunc->op==TK_AGG_FUNCTION );
  assert( !IsWindowFunc(pFunc) );
  assert( ExprUseXList(pFunc) );
  pEList = pFunc->x.pList;
  if( pEList==0
   || pEList->nExpr!=1
   || ExprHasProperty(pFunc, EP_WinFunc)
   || OptimizationDisabled(db, SQLITE_MinMaxOpt)
  ){
    return eRet;
  }
  assert( !ExprHasProperty(pFunc, EP_IntValue) );
  zFunc = pFunc->u.zToken;
  if( sqlite3StrICmp(zFunc, "min")==0 ){
    eRet = WHERE_ORDERBY_MIN;
    if( sqlite3ExprCanBeNull(pEList->a[0].pExpr) ){
      sortFlags = KEYINFO_ORDER_BIGNULL;
    }
  }else if( sqlite3StrICmp(zFunc, "max")==0 ){
    eRet = WHERE_ORDERBY_MAX;
    sortFlags = KEYINFO_ORDER_DESC;
  }else{
    return eRet;
  }
  *ppMinMax = pOrderBy = sqlite3ExprListDup(db, pEList, 0);
  assert( pOrderBy!=0 || db->mallocFailed );
  if( pOrderBy ) pOrderBy->a[0].fg.sortFlags = sortFlags;
  return eRet;
}